

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

TEnableStr<const_char_*> __thiscall
Diligent::Serializer<(Diligent::SerializerMode)0>::Serialize<char_const*>
          (Serializer<(Diligent::SerializerMode)0> *this,CharPtr Str)

{
  bool bVar1;
  size_t sVar2;
  char (*Args_1) [44];
  TPointer __s;
  char (*in_R8) [13];
  ulong uVar3;
  Uint32 LenWithNull;
  string msg;
  uint local_3c;
  string local_38;
  
  local_3c = 0;
  bVar1 = Copy<unsigned_int>(this,&local_3c,4);
  if (bVar1) {
    uVar3 = (ulong)local_3c;
    Args_1 = (char (*) [44])(this->m_Ptr + uVar3);
    if (Args_1 <= (char (*) [44])this->m_End) {
      __s = "";
      if (1 < local_3c) {
        __s = this->m_Ptr;
      }
      *Str = (char *)__s;
      if ((*__s != '\0') && (sVar2 = strlen((char *)__s), uVar3 <= sVar2)) {
        FormatString<char[26],char[44]>
                  (&local_38,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Str[0] == \'\\0\' || strlen(Str) < LenWithNull",Args_1);
        DebugAssertionFailed
                  (local_38._M_dataplus._M_p,"Serialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
                   ,0x16e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
      this->m_Ptr = this->m_Ptr + local_3c;
      return true;
    }
    FormatString<char[26],unsigned_int,char[13]>
              (&local_38,(Diligent *)"Note enough data to read ",(char (*) [26])&local_3c,
               (uint *)" characters.",in_R8);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Serialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x16b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

typename Serializer<SerializerMode::Read>::TEnableStr<T> Serializer<SerializerMode::Read>::Serialize(CharPtr Str)
{
    Uint32 LenWithNull = 0;
    if (!Serialize<Uint32>(LenWithNull))
        return false;

    CHECK_REMAINING_SIZE(LenWithNull, "Note enough data to read ", LenWithNull, " characters.");

    Str = LenWithNull > 1 ? reinterpret_cast<const char*>(m_Ptr) : "";
    VERIFY_EXPR(Str[0] == '\0' || strlen(Str) < LenWithNull);
    m_Ptr += LenWithNull;
    return true;
}